

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<4,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Scene *pSVar4;
  Geometry *pGVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  byte bVar24;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar25;
  AABBNodeMB4D *node1;
  ulong uVar26;
  uint uVar27;
  ulong uVar29;
  byte bVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  byte bVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar49;
  StackItemT<embree::NodeRefPtr<4>_> SVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  float fVar67;
  float fVar69;
  float fVar70;
  undefined1 auVar68 [16];
  float fVar71;
  undefined4 uVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  uint uVar77;
  uint uVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  int local_1154;
  StackItemT<embree::NodeRefPtr<4>_> *local_1150;
  ulong local_1148;
  RayHit *local_1140;
  RTCIntersectArguments *local_1138;
  long local_1130;
  long local_1128;
  RayQueryContext *local_1120;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  float local_fd8 [4];
  float local_fc8 [4];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar28;
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    local_1120 = context;
    local_1150 = stack + 1;
    stack[0].dist = 0;
    aVar1 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar41 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    fVar67 = (ray->super_RayK<1>).tfar;
    auVar65 = ZEXT464((uint)fVar67);
    auVar42 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar67));
    auVar38._8_4_ = 0x7fffffff;
    auVar38._0_8_ = 0x7fffffff7fffffff;
    auVar38._12_4_ = 0x7fffffff;
    auVar38 = vandps_avx512vl((undefined1  [16])aVar1,auVar38);
    auVar54._8_4_ = 0x219392ef;
    auVar54._0_8_ = 0x219392ef219392ef;
    auVar54._12_4_ = 0x219392ef;
    uVar29 = vcmpps_avx512vl(auVar38,auVar54,1);
    bVar6 = (bool)((byte)uVar29 & 1);
    auVar40._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * (int)aVar1.x;
    bVar6 = (bool)((byte)(uVar29 >> 1) & 1);
    auVar40._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * (int)aVar1.y;
    bVar6 = (bool)((byte)(uVar29 >> 2) & 1);
    auVar40._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * (int)aVar1.z;
    bVar6 = (bool)((byte)(uVar29 >> 3) & 1);
    auVar40._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * aVar1.field_3.a;
    auVar38 = vrcp14ps_avx512vl(auVar40);
    auVar39._8_4_ = 0x3f800000;
    auVar39._0_8_ = 0x3f8000003f800000;
    auVar39._12_4_ = 0x3f800000;
    auVar39 = vfnmadd213ps_avx512vl(auVar40,auVar38,auVar39);
    auVar53 = vfmadd132ps_fma(auVar39,auVar38,auVar38);
    auVar38 = vbroadcastss_avx512vl(auVar53);
    auVar81 = ZEXT1664(auVar38);
    auVar38 = vmovshdup_avx(auVar53);
    auVar39 = vshufps_avx512vl(auVar53,auVar53,0x55);
    auVar82 = ZEXT1664(auVar39);
    auVar39 = vshufpd_avx(auVar53,auVar53,1);
    auVar40 = vshufps_avx512vl(auVar53,auVar53,0xaa);
    auVar83 = ZEXT1664(auVar40);
    auVar59._0_4_ = auVar53._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar59._4_4_ = auVar53._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
    auVar59._8_4_ = auVar53._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
    auVar59._12_4_ = auVar53._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
    auVar55._4_4_ = auVar59._0_4_;
    auVar55._0_4_ = auVar59._0_4_;
    auVar55._8_4_ = auVar59._0_4_;
    auVar55._12_4_ = auVar59._0_4_;
    auVar40 = vshufps_avx(auVar59,auVar59,0x55);
    auVar59 = vshufps_avx(auVar59,auVar59,0xaa);
    local_1148 = (ulong)(auVar53._0_4_ < 0.0) << 4;
    uVar29 = (ulong)(auVar38._0_4_ < 0.0) << 4 | 0x20;
    uVar35 = (ulong)(auVar39._0_4_ < 0.0) << 4 | 0x40;
    uVar34 = local_1148 ^ 0x10;
    auVar41 = vbroadcastss_avx512vl(auVar41);
    auVar84 = ZEXT1664(auVar41);
    auVar53._8_4_ = 0x80000000;
    auVar53._0_8_ = 0x8000000080000000;
    auVar53._12_4_ = 0x80000000;
    uVar72 = auVar42._0_4_;
    auVar63 = ZEXT1664(CONCAT412(uVar72,CONCAT48(uVar72,CONCAT44(uVar72,uVar72))));
    auVar41 = vxorps_avx512vl(auVar55,auVar53);
    auVar85 = ZEXT1664(auVar41);
    auVar41 = vxorps_avx512vl(auVar40,auVar53);
    auVar86 = ZEXT1664(auVar41);
    auVar41 = vxorps_avx512vl(auVar59,auVar53);
    auVar87 = ZEXT1664(auVar41);
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar88 = ZEXT1664(auVar41);
    auVar41 = vmovddup_avx512vl(ZEXT816(0x8000000080000000));
    auVar89 = ZEXT1664(auVar41);
    auVar41 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
    auVar90 = ZEXT1664(auVar41);
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar91 = ZEXT1664(auVar41);
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar92 = ZEXT1664(auVar41);
    local_1140 = ray;
LAB_01bd5b0f:
    if (local_1150 != stack) {
      pSVar25 = local_1150 + -1;
      local_1150 = local_1150 + -1;
      if ((float)pSVar25->dist <= auVar65._0_4_) {
        uVar37 = (local_1150->ptr).ptr;
        while ((uVar37 & 8) == 0) {
          uVar26 = uVar37 & 0xfffffffffffffff0;
          uVar72 = *(undefined4 *)((long)&(local_1140->super_RayK<1>).dir.field_0 + 0xc);
          auVar51._4_4_ = uVar72;
          auVar51._0_4_ = uVar72;
          auVar51._8_4_ = uVar72;
          auVar51._12_4_ = uVar72;
          auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x80 + local_1148),auVar51,
                                    *(undefined1 (*) [16])(uVar26 + 0x20 + local_1148));
          auVar42 = vfmadd213ps_avx512vl(auVar41,auVar81._0_16_,auVar85._0_16_);
          auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x80 + uVar29),auVar51,
                                    *(undefined1 (*) [16])(uVar26 + 0x20 + uVar29));
          auVar38 = vmaxps_avx512vl(auVar84._0_16_,auVar42);
          auVar42 = vfmadd213ps_avx512vl(auVar41,auVar82._0_16_,auVar86._0_16_);
          auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x80 + uVar35),auVar51,
                                    *(undefined1 (*) [16])(uVar26 + 0x20 + uVar35));
          auVar41 = vfmadd213ps_avx512vl(auVar41,auVar83._0_16_,auVar87._0_16_);
          auVar41 = vmaxps_avx(auVar42,auVar41);
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x80 + uVar34),auVar51,
                                    *(undefined1 (*) [16])(uVar26 + 0x20 + uVar34));
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar38,auVar41)
          ;
          auVar41 = vfmadd213ps_avx512vl(auVar42,auVar81._0_16_,auVar85._0_16_);
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x80 + (uVar29 ^ 0x10)),auVar51,
                                    *(undefined1 (*) [16])(uVar26 + 0x20 + (uVar29 ^ 0x10)));
          auVar41 = vminps_avx(auVar63._0_16_,auVar41);
          auVar38 = vfmadd213ps_avx512vl(auVar42,auVar82._0_16_,auVar86._0_16_);
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar26 + 0x80 + (uVar35 ^ 0x10)),auVar51,
                                    *(undefined1 (*) [16])(uVar26 + 0x20 + (uVar35 ^ 0x10)));
          auVar42 = vfmadd213ps_avx512vl(auVar42,auVar83._0_16_,auVar87._0_16_);
          auVar42 = vminps_avx(auVar38,auVar42);
          auVar41 = vminps_avx(auVar41,auVar42);
          uVar14 = vcmpps_avx512vl((undefined1  [16])tNear.field_0,auVar41,2);
          uVar27 = (uint)uVar14;
          if (((uint)uVar37 & 7) == 6) {
            uVar15 = vcmpps_avx512vl(auVar51,*(undefined1 (*) [16])(uVar26 + 0xf0),1);
            uVar16 = vcmpps_avx512vl(auVar51,*(undefined1 (*) [16])(uVar26 + 0xe0),0xd);
            uVar27 = (uint)(byte)((byte)uVar15 & (byte)uVar16 & (byte)uVar14);
          }
          if ((byte)uVar27 == 0) {
            auVar41 = vmovshdup_avx(*(undefined1 (*) [16])
                                     ((long)&(local_1140->super_RayK<1>).dir.field_0 + 0xc));
            auVar65 = ZEXT1664(auVar41);
            goto LAB_01bd5b0f;
          }
          lVar32 = 0;
          for (uVar37 = (ulong)(byte)uVar27; (uVar37 & 1) == 0;
              uVar37 = uVar37 >> 1 | 0x8000000000000000) {
            lVar32 = lVar32 + 1;
          }
          uVar37 = *(ulong *)(uVar26 + lVar32 * 8);
          uVar27 = (uVar27 & 0xff) - 1 & uVar27 & 0xff;
          uVar28 = (ulong)uVar27;
          if (uVar27 != 0) {
            uVar77 = tNear.field_0.i[lVar32];
            lVar32 = 0;
            for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
              lVar32 = lVar32 + 1;
            }
            uVar27 = uVar27 - 1 & uVar27;
            uVar33 = (ulong)uVar27;
            uVar28 = *(ulong *)(uVar26 + lVar32 * 8);
            uVar31 = tNear.field_0.i[lVar32];
            if (uVar27 == 0) {
              if (uVar77 < uVar31) {
                (local_1150->ptr).ptr = uVar28;
                local_1150->dist = uVar31;
                local_1150 = local_1150 + 1;
              }
              else {
                (local_1150->ptr).ptr = uVar37;
                local_1150->dist = uVar77;
                local_1150 = local_1150 + 1;
                uVar37 = uVar28;
              }
            }
            else {
              auVar41._8_8_ = 0;
              auVar41._0_8_ = uVar37;
              auVar41 = vpunpcklqdq_avx(auVar41,ZEXT416(uVar77));
              auVar42._8_8_ = 0;
              auVar42._0_8_ = uVar28;
              auVar42 = vpunpcklqdq_avx(auVar42,ZEXT416(uVar31));
              lVar32 = 0;
              for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                lVar32 = lVar32 + 1;
              }
              uVar27 = uVar27 - 1 & uVar27;
              uVar37 = (ulong)uVar27;
              auVar52._8_8_ = 0;
              auVar52._0_8_ = *(ulong *)(uVar26 + lVar32 * 8);
              auVar59 = vpunpcklqdq_avx(auVar52,ZEXT416((uint)tNear.field_0.i[lVar32]));
              auVar38 = vpshufd_avx(auVar41,0xaa);
              auVar39 = vpshufd_avx(auVar42,0xaa);
              auVar40 = vpshufd_avx(auVar59,0xaa);
              if (uVar27 == 0) {
                uVar37 = vpcmpgtd_avx512vl(auVar39,auVar38);
                uVar37 = uVar37 & 0xf;
                auVar39 = vpblendmd_avx512vl(auVar42,auVar41);
                bVar6 = (bool)((byte)uVar37 & 1);
                auVar43._0_4_ = (uint)bVar6 * auVar39._0_4_ | (uint)!bVar6 * auVar38._0_4_;
                bVar6 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar43._4_4_ = (uint)bVar6 * auVar39._4_4_ | (uint)!bVar6 * auVar38._4_4_;
                bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar43._8_4_ = (uint)bVar6 * auVar39._8_4_ | (uint)!bVar6 * auVar38._8_4_;
                bVar6 = SUB81(uVar37 >> 3,0);
                auVar43._12_4_ = (uint)bVar6 * auVar39._12_4_ | (uint)!bVar6 * auVar38._12_4_;
                auVar42 = vmovdqa32_avx512vl(auVar42);
                bVar6 = (bool)((byte)uVar37 & 1);
                auVar44._0_4_ = (uint)bVar6 * auVar42._0_4_ | (uint)!bVar6 * auVar41._0_4_;
                bVar6 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar44._4_4_ = (uint)bVar6 * auVar42._4_4_ | (uint)!bVar6 * auVar41._4_4_;
                bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar44._8_4_ = (uint)bVar6 * auVar42._8_4_ | (uint)!bVar6 * auVar41._8_4_;
                bVar6 = SUB81(uVar37 >> 3,0);
                auVar44._12_4_ = (uint)bVar6 * auVar42._12_4_ | (uint)!bVar6 * auVar41._12_4_;
                auVar41 = vpshufd_avx(auVar43,0xaa);
                uVar26 = vpcmpgtd_avx512vl(auVar40,auVar41);
                uVar26 = uVar26 & 0xf;
                auVar42 = vpblendmd_avx512vl(auVar59,auVar43);
                bVar6 = (bool)((byte)uVar26 & 1);
                bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
                uVar37 = CONCAT44((uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar41._4_4_,
                                  (uint)bVar6 * auVar42._0_4_ | (uint)!bVar6 * auVar41._0_4_);
                auVar41 = vmovdqa32_avx512vl(auVar59);
                bVar6 = (bool)((byte)uVar26 & 1);
                auVar45._0_4_ = (uint)bVar6 * auVar41._0_4_ | !bVar6 * auVar43._0_4_;
                bVar6 = (bool)((byte)(uVar26 >> 1) & 1);
                auVar45._4_4_ = (uint)bVar6 * auVar41._4_4_ | !bVar6 * auVar43._4_4_;
                bVar6 = (bool)((byte)(uVar26 >> 2) & 1);
                auVar45._8_4_ = (uint)bVar6 * auVar41._8_4_ | !bVar6 * auVar43._8_4_;
                bVar6 = SUB81(uVar26 >> 3,0);
                auVar45._12_4_ = (uint)bVar6 * auVar41._12_4_ | !bVar6 * auVar43._12_4_;
                auVar41 = vpshufd_avx(auVar45,0xaa);
                auVar42 = vpshufd_avx(auVar44,0xaa);
                uVar26 = vpcmpgtd_avx512vl(auVar41,auVar42);
                uVar26 = uVar26 & 0xf;
                auVar42 = vpblendmd_avx512vl(auVar45,auVar44);
                bVar6 = (bool)((byte)uVar26 & 1);
                bVar8 = (bool)((byte)(uVar26 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar26 >> 2) & 1);
                bVar12 = SUB81(uVar26 >> 3,0);
                auVar38 = vmovdqa32_avx512vl(auVar45);
                bVar7 = (bool)((byte)uVar26 & 1);
                bVar9 = (bool)((byte)(uVar26 >> 1) & 1);
                bVar11 = (bool)((byte)(uVar26 >> 2) & 1);
                bVar13 = SUB81(uVar26 >> 3,0);
                *(uint *)&(local_1150->ptr).ptr =
                     (uint)bVar7 * auVar38._0_4_ | !bVar7 * auVar44._0_4_;
                *(uint *)((long)&(local_1150->ptr).ptr + 4) =
                     (uint)bVar9 * auVar38._4_4_ | !bVar9 * auVar44._4_4_;
                local_1150->dist = (uint)bVar11 * auVar38._8_4_ | !bVar11 * auVar44._8_4_;
                *(uint *)&local_1150->field_0xc =
                     (uint)bVar13 * auVar38._12_4_ | !bVar13 * auVar44._12_4_;
                *(uint *)&local_1150[1].ptr.ptr =
                     (uint)bVar6 * auVar42._0_4_ | (uint)!bVar6 * auVar41._0_4_;
                *(uint *)((long)&local_1150[1].ptr.ptr + 4) =
                     (uint)bVar8 * auVar42._4_4_ | (uint)!bVar8 * auVar41._4_4_;
                local_1150[1].dist = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * auVar41._8_4_;
                *(uint *)&local_1150[1].field_0xc =
                     (uint)bVar12 * auVar42._12_4_ | (uint)!bVar12 * auVar41._12_4_;
                local_1150 = local_1150 + 2;
              }
              else {
                lVar32 = 0;
                for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
                  lVar32 = lVar32 + 1;
                }
                uVar27 = tNear.field_0.i[lVar32];
                auVar75._8_8_ = 0;
                auVar75._0_8_ = *(ulong *)(uVar26 + lVar32 * 8);
                auVar53 = vpunpcklqdq_avx(auVar75,ZEXT416(uVar27));
                uVar37 = vpcmpgtd_avx512vl(auVar39,auVar38);
                uVar37 = uVar37 & 0xf;
                auVar39 = vpblendmd_avx512vl(auVar42,auVar41);
                bVar6 = (bool)((byte)uVar37 & 1);
                auVar56._0_4_ = (uint)bVar6 * auVar39._0_4_ | (uint)!bVar6 * auVar38._0_4_;
                bVar6 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar56._4_4_ = (uint)bVar6 * auVar39._4_4_ | (uint)!bVar6 * auVar38._4_4_;
                bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar56._8_4_ = (uint)bVar6 * auVar39._8_4_ | (uint)!bVar6 * auVar38._8_4_;
                bVar6 = SUB81(uVar37 >> 3,0);
                auVar56._12_4_ = (uint)bVar6 * auVar39._12_4_ | (uint)!bVar6 * auVar38._12_4_;
                auVar42 = vmovdqa32_avx512vl(auVar42);
                bVar6 = (bool)((byte)uVar37 & 1);
                auVar57._0_4_ = (uint)bVar6 * auVar42._0_4_ | (uint)!bVar6 * auVar41._0_4_;
                bVar6 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar57._4_4_ = (uint)bVar6 * auVar42._4_4_ | (uint)!bVar6 * auVar41._4_4_;
                bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar57._8_4_ = (uint)bVar6 * auVar42._8_4_ | (uint)!bVar6 * auVar41._8_4_;
                bVar6 = SUB81(uVar37 >> 3,0);
                auVar57._12_4_ = (uint)bVar6 * auVar42._12_4_ | (uint)!bVar6 * auVar41._12_4_;
                auVar68._4_4_ = uVar27;
                auVar68._0_4_ = uVar27;
                auVar68._8_4_ = uVar27;
                auVar68._12_4_ = uVar27;
                uVar37 = vpcmpgtd_avx512vl(auVar68,auVar40);
                uVar37 = uVar37 & 0xf;
                auVar41 = vpblendmd_avx512vl(auVar53,auVar59);
                bVar6 = (bool)((byte)uVar37 & 1);
                auVar58._0_4_ = (uint)bVar6 * auVar41._0_4_ | !bVar6 * uVar27;
                bVar6 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar58._4_4_ = (uint)bVar6 * auVar41._4_4_ | !bVar6 * uVar27;
                bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar58._8_4_ = (uint)bVar6 * auVar41._8_4_ | !bVar6 * uVar27;
                bVar6 = SUB81(uVar37 >> 3,0);
                auVar58._12_4_ = (uint)bVar6 * auVar41._12_4_ | !bVar6 * uVar27;
                auVar41 = vmovdqa32_avx512vl(auVar53);
                bVar6 = (bool)((byte)uVar37 & 1);
                auVar46._0_4_ = (uint)bVar6 * auVar41._0_4_ | (uint)!bVar6 * auVar59._0_4_;
                bVar6 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar46._4_4_ = (uint)bVar6 * auVar41._4_4_ | (uint)!bVar6 * auVar59._4_4_;
                bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar46._8_4_ = (uint)bVar6 * auVar41._8_4_ | (uint)!bVar6 * auVar59._8_4_;
                bVar6 = SUB81(uVar37 >> 3,0);
                auVar46._12_4_ = (uint)bVar6 * auVar41._12_4_ | (uint)!bVar6 * auVar59._12_4_;
                auVar41 = vpshufd_avx(auVar46,0xaa);
                auVar42 = vpshufd_avx(auVar57,0xaa);
                uVar37 = vpcmpgtd_avx512vl(auVar41,auVar42);
                uVar37 = uVar37 & 0xf;
                auVar42 = vpblendmd_avx512vl(auVar46,auVar57);
                bVar6 = (bool)((byte)uVar37 & 1);
                auVar47._0_4_ = (uint)bVar6 * auVar42._0_4_ | (uint)!bVar6 * auVar41._0_4_;
                bVar6 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar47._4_4_ = (uint)bVar6 * auVar42._4_4_ | (uint)!bVar6 * auVar41._4_4_;
                bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar47._8_4_ = (uint)bVar6 * auVar42._8_4_ | (uint)!bVar6 * auVar41._8_4_;
                bVar6 = SUB81(uVar37 >> 3,0);
                auVar47._12_4_ = (uint)bVar6 * auVar42._12_4_ | (uint)!bVar6 * auVar41._12_4_;
                auVar38 = vmovdqa32_avx512vl(auVar46);
                bVar6 = (bool)((byte)uVar37 & 1);
                bVar8 = (bool)((byte)(uVar37 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar37 >> 2) & 1);
                bVar11 = SUB81(uVar37 >> 3,0);
                auVar41 = vpshufd_avx(auVar58,0xaa);
                auVar42 = vpshufd_avx(auVar56,0xaa);
                uVar26 = vpcmpgtd_avx512vl(auVar41,auVar42);
                uVar26 = uVar26 & 0xf;
                auVar42 = vpblendmd_avx512vl(auVar58,auVar56);
                bVar7 = (bool)((byte)uVar26 & 1);
                bVar9 = (bool)((byte)(uVar26 >> 1) & 1);
                uVar37 = CONCAT44((uint)bVar9 * auVar42._4_4_ | (uint)!bVar9 * auVar41._4_4_,
                                  (uint)bVar7 * auVar42._0_4_ | (uint)!bVar7 * auVar41._0_4_);
                auVar41 = vmovdqa32_avx512vl(auVar58);
                bVar7 = (bool)((byte)uVar26 & 1);
                auVar48._0_4_ = (uint)bVar7 * auVar41._0_4_ | !bVar7 * auVar56._0_4_;
                bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
                auVar48._4_4_ = (uint)bVar7 * auVar41._4_4_ | !bVar7 * auVar56._4_4_;
                bVar7 = (bool)((byte)(uVar26 >> 2) & 1);
                auVar48._8_4_ = (uint)bVar7 * auVar41._8_4_ | !bVar7 * auVar56._8_4_;
                bVar7 = SUB81(uVar26 >> 3,0);
                auVar48._12_4_ = (uint)bVar7 * auVar41._12_4_ | !bVar7 * auVar56._12_4_;
                auVar41 = vpshufd_avx(auVar48,0xaa);
                auVar42 = vpshufd_avx(auVar47,0xaa);
                uVar26 = vpcmpgtd_avx512vl(auVar42,auVar41);
                uVar26 = uVar26 & 0xf;
                auVar42 = vpblendmd_avx512vl(auVar47,auVar48);
                bVar7 = (bool)((byte)uVar26 & 1);
                SVar49.ptr.ptr._0_4_ = (uint)bVar7 * auVar42._0_4_ | (uint)!bVar7 * auVar41._0_4_;
                bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
                SVar49.ptr.ptr._4_4_ = (uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar41._4_4_;
                bVar7 = (bool)((byte)(uVar26 >> 2) & 1);
                SVar49.dist = (uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * auVar41._8_4_;
                bVar7 = SUB81(uVar26 >> 3,0);
                SVar49._12_4_ = (uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * auVar41._12_4_;
                auVar41 = vmovdqa32_avx512vl(auVar47);
                bVar7 = (bool)((byte)uVar26 & 1);
                SVar50.ptr.ptr._0_4_ = (uint)bVar7 * auVar41._0_4_ | !bVar7 * auVar48._0_4_;
                bVar7 = (bool)((byte)(uVar26 >> 1) & 1);
                SVar50.ptr.ptr._4_4_ = (uint)bVar7 * auVar41._4_4_ | !bVar7 * auVar48._4_4_;
                bVar7 = (bool)((byte)(uVar26 >> 2) & 1);
                SVar50.dist = (uint)bVar7 * auVar41._8_4_ | !bVar7 * auVar48._8_4_;
                bVar7 = SUB81(uVar26 >> 3,0);
                SVar50._12_4_ = (uint)bVar7 * auVar41._12_4_ | !bVar7 * auVar48._12_4_;
                *(uint *)&(local_1150->ptr).ptr =
                     (uint)bVar6 * auVar38._0_4_ | !bVar6 * auVar57._0_4_;
                *(uint *)((long)&(local_1150->ptr).ptr + 4) =
                     (uint)bVar8 * auVar38._4_4_ | !bVar8 * auVar57._4_4_;
                local_1150->dist = (uint)bVar10 * auVar38._8_4_ | !bVar10 * auVar57._8_4_;
                *(uint *)&local_1150->field_0xc =
                     (uint)bVar11 * auVar38._12_4_ | !bVar11 * auVar57._12_4_;
                local_1150[1] = SVar50;
                local_1150[2] = SVar49;
                local_1150 = local_1150 + 3;
              }
            }
          }
        }
        local_1128 = (ulong)((uint)uVar37 & 0xf) - 8;
        uVar37 = uVar37 & 0xfffffffffffffff0;
        for (local_1130 = 0; local_1130 != local_1128; local_1130 = local_1130 + 1) {
          lVar32 = local_1130 * 0x140;
          uVar72 = *(undefined4 *)((long)&(local_1140->super_RayK<1>).dir.field_0 + 0xc);
          auVar61._4_4_ = uVar72;
          auVar61._0_4_ = uVar72;
          auVar61._8_4_ = uVar72;
          auVar61._12_4_ = uVar72;
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0x90 + lVar32),auVar61,
                                    *(undefined1 (*) [16])(uVar37 + lVar32));
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0xa0 + lVar32),auVar61,
                                    *(undefined1 (*) [16])(uVar37 + 0x10 + lVar32));
          auVar55 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0xb0 + lVar32),auVar61,
                                    *(undefined1 (*) [16])(uVar37 + 0x20 + lVar32));
          auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0xc0 + lVar32),auVar61,
                                    *(undefined1 (*) [16])(uVar37 + 0x30 + lVar32));
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0xd0 + lVar32),auVar61,
                                    *(undefined1 (*) [16])(uVar37 + 0x40 + lVar32));
          auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0xe0 + lVar32),auVar61,
                                    *(undefined1 (*) [16])(uVar37 + 0x50 + lVar32));
          auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0xf0 + lVar32),auVar61,
                                    *(undefined1 (*) [16])(uVar37 + 0x60 + lVar32));
          auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0x100 + lVar32),auVar61,
                                    *(undefined1 (*) [16])(uVar37 + 0x70 + lVar32));
          auVar59 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar37 + 0x110 + lVar32),auVar61,
                                    *(undefined1 (*) [16])(uVar37 + 0x80 + lVar32));
          auVar41 = vsubps_avx(auVar53,auVar41);
          auVar42 = vsubps_avx(auVar54,auVar42);
          auVar38 = vsubps_avx(auVar55,auVar38);
          auVar39 = vsubps_avx(auVar39,auVar53);
          auVar40 = vsubps_avx(auVar40,auVar54);
          auVar59 = vsubps_avx(auVar59,auVar55);
          auVar62._0_4_ = auVar42._0_4_ * auVar59._0_4_;
          auVar62._4_4_ = auVar42._4_4_ * auVar59._4_4_;
          auVar62._8_4_ = auVar42._8_4_ * auVar59._8_4_;
          auVar62._12_4_ = auVar42._12_4_ * auVar59._12_4_;
          local_fa8 = vfmsub231ps_fma(auVar62,auVar40,auVar38);
          auVar64._0_4_ = auVar38._0_4_ * auVar39._0_4_;
          auVar64._4_4_ = auVar38._4_4_ * auVar39._4_4_;
          auVar64._8_4_ = auVar38._8_4_ * auVar39._8_4_;
          auVar64._12_4_ = auVar38._12_4_ * auVar39._12_4_;
          local_f98 = vfmsub231ps_fma(auVar64,auVar59,auVar41);
          auVar66._0_4_ = auVar41._0_4_ * auVar40._0_4_;
          auVar66._4_4_ = auVar41._4_4_ * auVar40._4_4_;
          auVar66._8_4_ = auVar41._8_4_ * auVar40._8_4_;
          auVar66._12_4_ = auVar41._12_4_ * auVar40._12_4_;
          uVar72 = *(undefined4 *)&(local_1140->super_RayK<1>).dir.field_0;
          auVar80._4_4_ = uVar72;
          auVar80._0_4_ = uVar72;
          auVar80._8_4_ = uVar72;
          auVar80._12_4_ = uVar72;
          auVar51 = vbroadcastss_avx512vl
                              (ZEXT416((uint)(local_1140->super_RayK<1>).dir.field_0.m128[1]));
          auVar52 = vbroadcastss_avx512vl
                              (ZEXT416((uint)(local_1140->super_RayK<1>).dir.field_0.m128[2]));
          uVar72 = *(undefined4 *)&(local_1140->super_RayK<1>).org.field_0;
          auVar18._4_4_ = uVar72;
          auVar18._0_4_ = uVar72;
          auVar18._8_4_ = uVar72;
          auVar18._12_4_ = uVar72;
          auVar53 = vsubps_avx512vl(auVar53,auVar18);
          local_f88 = vfmsub231ps_fma(auVar66,auVar39,auVar42);
          uVar72 = *(undefined4 *)((long)&(local_1140->super_RayK<1>).org.field_0 + 4);
          auVar19._4_4_ = uVar72;
          auVar19._0_4_ = uVar72;
          auVar19._8_4_ = uVar72;
          auVar19._12_4_ = uVar72;
          auVar54 = vsubps_avx512vl(auVar54,auVar19);
          uVar72 = *(undefined4 *)((long)&(local_1140->super_RayK<1>).org.field_0 + 8);
          auVar20._4_4_ = uVar72;
          auVar20._0_4_ = uVar72;
          auVar20._8_4_ = uVar72;
          auVar20._12_4_ = uVar72;
          auVar55 = vsubps_avx512vl(auVar55,auVar20);
          auVar56 = vmulps_avx512vl(auVar51,auVar55);
          auVar56 = vfmsub231ps_avx512vl(auVar56,auVar54,auVar52);
          auVar57 = vmulps_avx512vl(auVar52,auVar53);
          auVar57 = vfmsub231ps_avx512vl(auVar57,auVar55,auVar80);
          auVar58 = vmulps_avx512vl(auVar80,auVar54);
          auVar58 = vfmsub231ps_avx512vl(auVar58,auVar53,auVar51);
          auVar52 = vmulps_avx512vl(local_f88,auVar52);
          auVar51 = vfmadd231ps_avx512vl(auVar52,local_f98,auVar51);
          auVar51 = vfmadd231ps_avx512vl(auVar51,local_fa8,auVar80);
          auVar52 = vandps_avx512vl(auVar51,auVar88._0_16_);
          auVar59 = vmulps_avx512vl(auVar59,auVar58);
          auVar40 = vfmadd231ps_avx512vl(auVar59,auVar57,auVar40);
          auVar39 = vfmadd231ps_fma(auVar40,auVar56,auVar39);
          auVar40 = vandps_avx512vl(auVar51,auVar89._0_16_);
          uVar27 = auVar40._0_4_;
          tNear.field_0._0_4_ = (float)(uVar27 ^ auVar39._0_4_);
          uVar77 = auVar40._4_4_;
          tNear.field_0._4_4_ = (float)(uVar77 ^ auVar39._4_4_);
          uVar31 = auVar40._8_4_;
          tNear.field_0._8_4_ = (float)(uVar31 ^ auVar39._8_4_);
          uVar78 = auVar40._12_4_;
          tNear.field_0._12_4_ = (float)(uVar78 ^ auVar39._12_4_);
          auVar38 = vmulps_avx512vl(auVar38,auVar58);
          auVar42 = vfmadd231ps_avx512vl(auVar38,auVar42,auVar57);
          auVar41 = vfmadd231ps_fma(auVar42,auVar41,auVar56);
          auVar73._0_4_ = (float)(uVar27 ^ auVar41._0_4_);
          auVar73._4_4_ = (float)(uVar77 ^ auVar41._4_4_);
          auVar73._8_4_ = (float)(uVar31 ^ auVar41._8_4_);
          auVar73._12_4_ = (float)(uVar78 ^ auVar41._12_4_);
          auVar41 = auVar90._0_16_;
          uVar14 = vcmpps_avx512vl((undefined1  [16])tNear.field_0,auVar41,5);
          uVar15 = vcmpps_avx512vl(auVar73,auVar41,5);
          uVar16 = vcmpps_avx512vl(auVar51,auVar41,4);
          auVar79._0_4_ = tNear.field_0._0_4_ + auVar73._0_4_;
          auVar79._4_4_ = tNear.field_0._4_4_ + auVar73._4_4_;
          auVar79._8_4_ = tNear.field_0._8_4_ + auVar73._8_4_;
          auVar79._12_4_ = tNear.field_0._12_4_ + auVar73._12_4_;
          uVar17 = vcmpps_avx512vl(auVar79,auVar52,2);
          bVar36 = (byte)uVar14 & (byte)uVar15 & (byte)uVar16 & (byte)uVar17;
          if (bVar36 != 0) {
            auVar76._0_4_ = auVar55._0_4_ * local_f88._0_4_;
            auVar76._4_4_ = auVar55._4_4_ * local_f88._4_4_;
            auVar76._8_4_ = auVar55._8_4_ * local_f88._8_4_;
            auVar76._12_4_ = auVar55._12_4_ * local_f88._12_4_;
            auVar41 = vfmadd213ps_fma(auVar54,local_f98,auVar76);
            auVar41 = vfmadd213ps_fma(auVar53,local_fa8,auVar41);
            auVar74._0_4_ = (float)(uVar27 ^ auVar41._0_4_);
            auVar74._4_4_ = (float)(uVar77 ^ auVar41._4_4_);
            auVar74._8_4_ = (float)(uVar31 ^ auVar41._8_4_);
            auVar74._12_4_ = (float)(uVar78 ^ auVar41._12_4_);
            uVar72 = *(undefined4 *)((long)&(local_1140->super_RayK<1>).org.field_0 + 0xc);
            auVar21._4_4_ = uVar72;
            auVar21._0_4_ = uVar72;
            auVar21._8_4_ = uVar72;
            auVar21._12_4_ = uVar72;
            auVar41 = vmulps_avx512vl(auVar52,auVar21);
            fVar67 = (local_1140->super_RayK<1>).tfar;
            auVar22._4_4_ = fVar67;
            auVar22._0_4_ = fVar67;
            auVar22._8_4_ = fVar67;
            auVar22._12_4_ = fVar67;
            auVar42 = vmulps_avx512vl(auVar52,auVar22);
            uVar14 = vcmpps_avx512vl(auVar74,auVar42,2);
            uVar15 = vcmpps_avx512vl(auVar41,auVar74,1);
            bVar36 = (byte)uVar14 & (byte)uVar15 & bVar36;
            if (bVar36 != 0) {
              lVar32 = lVar32 + uVar37;
              auVar2._0_4_ = (local_1140->super_RayK<1>).tfar;
              auVar2._4_4_ = (local_1140->super_RayK<1>).mask;
              auVar2._8_4_ = (local_1140->super_RayK<1>).id;
              auVar2._12_4_ = (local_1140->super_RayK<1>).flags;
              auVar65 = ZEXT1664(auVar2);
              uVar27 = vextractps_avx(auVar2,1);
              auVar41 = vrcp14ps_avx512vl(auVar52);
              auVar42 = vfnmadd213ps_avx512vl(auVar52,auVar41,auVar91._0_16_);
              auVar41 = vfmadd132ps_fma(auVar42,auVar41,auVar41);
              fVar67 = auVar41._0_4_;
              local_fb8._0_4_ = fVar67 * auVar74._0_4_;
              fVar69 = auVar41._4_4_;
              local_fb8._4_4_ = fVar69 * auVar74._4_4_;
              fVar70 = auVar41._8_4_;
              local_fb8._8_4_ = fVar70 * auVar74._8_4_;
              fVar71 = auVar41._12_4_;
              local_fb8._12_4_ = fVar71 * auVar74._12_4_;
              auVar63 = ZEXT1664(local_fb8);
              local_fd8[0] = fVar67 * tNear.field_0._0_4_;
              local_fd8[1] = fVar69 * tNear.field_0._4_4_;
              local_fd8[2] = fVar70 * tNear.field_0._8_4_;
              local_fd8[3] = fVar71 * tNear.field_0._12_4_;
              local_fc8[0] = fVar67 * auVar73._0_4_;
              local_fc8[1] = fVar69 * auVar73._4_4_;
              local_fc8[2] = fVar70 * auVar73._8_4_;
              local_fc8[3] = fVar71 * auVar73._12_4_;
              pSVar4 = local_1120->scene;
              auVar41 = vblendmps_avx512vl(auVar92._0_16_,local_fb8);
              auVar60._0_4_ =
                   (uint)(bVar36 & 1) * auVar41._0_4_ |
                   (uint)!(bool)(bVar36 & 1) * (int)(fVar67 * auVar73._0_4_);
              bVar6 = (bool)(bVar36 >> 1 & 1);
              auVar60._4_4_ =
                   (uint)bVar6 * auVar41._4_4_ | (uint)!bVar6 * (int)(fVar69 * auVar73._4_4_);
              bVar6 = (bool)(bVar36 >> 2 & 1);
              auVar60._8_4_ =
                   (uint)bVar6 * auVar41._8_4_ | (uint)!bVar6 * (int)(fVar70 * auVar73._8_4_);
              bVar6 = (bool)(bVar36 >> 3 & 1);
              auVar60._12_4_ =
                   (uint)bVar6 * auVar41._12_4_ | (uint)!bVar6 * (int)(fVar71 * auVar73._12_4_);
              auVar41 = vshufps_avx(auVar60,auVar60,0xb1);
              auVar41 = vminps_avx(auVar41,auVar60);
              auVar42 = vshufpd_avx(auVar41,auVar41,1);
              auVar41 = vminps_avx(auVar42,auVar41);
              uVar14 = vcmpps_avx512vl(auVar60,auVar41,0);
              bVar24 = bVar36;
              if (((byte)uVar14 & bVar36) != 0) {
                bVar24 = (byte)uVar14 & bVar36;
              }
              uVar77 = 0;
              for (uVar31 = (uint)bVar24; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x80000000) {
                uVar77 = uVar77 + 1;
              }
              do {
                auVar41 = auVar90._0_16_;
                uVar31 = uVar77 & 0xff;
                h.geomID = *(uint *)(lVar32 + 0x120 + (ulong)uVar31 * 4);
                pGVar5 = (pSVar4->geometries).items[h.geomID].ptr;
                if ((pGVar5->mask & uVar27) == 0) {
                  bVar36 = ~(byte)(1 << (uVar77 & 0x1f)) & bVar36;
                  auVar42 = auVar60;
                }
                else {
                  local_1138 = local_1120->args;
                  auVar42 = auVar65._0_16_;
                  auVar38 = auVar63._0_16_;
                  if (local_1120->args->filter == (RTCFilterFunctionN)0x0) {
                    args.context = local_1120->user;
                    if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                      uVar26 = (ulong)(uVar31 << 2);
                      fVar67 = *(float *)((long)local_fd8 + uVar26);
                      fVar69 = *(float *)((long)local_fc8 + uVar26);
                      (local_1140->super_RayK<1>).tfar = *(float *)(local_fb8 + uVar26);
                      (local_1140->Ng).field_0.field_0.x = *(float *)(local_fa8 + uVar26);
                      (local_1140->Ng).field_0.field_0.y = *(float *)(local_f98 + uVar26);
                      (local_1140->Ng).field_0.field_0.z = *(float *)(local_f88 + uVar26);
                      local_1140->u = fVar67;
                      local_1140->v = fVar69;
                      local_1140->primID = *(uint *)(lVar32 + 0x130 + uVar26);
                      local_1140->geomID = h.geomID;
                      local_1140->instID[0] = (args.context)->instID[0];
                      local_1140->instPrimID[0] = (args.context)->instPrimID[0];
                      break;
                    }
                  }
                  else {
                    args.context = local_1120->user;
                  }
                  uVar26 = (ulong)(uVar31 * 4);
                  h.Ng.field_0.field_0.x = *(float *)(local_fa8 + uVar26);
                  h.Ng.field_0.field_0.y = *(float *)(local_f98 + uVar26);
                  h.Ng.field_0.field_0.z = *(float *)(local_f88 + uVar26);
                  h.u = *(float *)((long)local_fd8 + uVar26);
                  h.v = *(float *)((long)local_fc8 + uVar26);
                  h.primID = *(uint *)(lVar32 + 0x130 + uVar26);
                  h.instID[0] = (args.context)->instID[0];
                  h.instPrimID[0] = (args.context)->instPrimID[0];
                  (local_1140->super_RayK<1>).tfar = *(float *)(local_fb8 + uVar26);
                  local_1154 = -1;
                  args.valid = &local_1154;
                  args.geometryUserPtr = pGVar5->userPtr;
                  args.ray = (RTCRayN *)local_1140;
                  args.hit = (RTCHitN *)&h;
                  args.N = 1;
                  if (((pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                      ((*pGVar5->intersectionFilterN)(&args), *args.valid != 0)) &&
                     ((local_1138->filter == (RTCFilterFunctionN)0x0 ||
                      ((((local_1138->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        (((pGVar5->field_8).field_0x2 & 0x40) == 0)) ||
                       ((*local_1138->filter)(&args), *args.valid != 0)))))) {
                    *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                    *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                    *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                    *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                    auVar42 = ZEXT416(*(uint *)(args.hit + 0x10));
                    *(uint *)(args.ray + 0x40) = *(uint *)(args.hit + 0x10);
                    *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                    *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                    *(undefined4 *)(args.ray + 0x4c) = *(undefined4 *)(args.hit + 0x1c);
                    *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
                  }
                  else {
                    (local_1140->super_RayK<1>).tfar = auVar65._0_4_;
                  }
                  auVar3._0_4_ = (local_1140->super_RayK<1>).tfar;
                  auVar3._4_4_ = (local_1140->super_RayK<1>).mask;
                  auVar3._8_4_ = (local_1140->super_RayK<1>).id;
                  auVar3._12_4_ = (local_1140->super_RayK<1>).flags;
                  auVar65 = ZEXT1664(auVar3);
                  auVar63 = ZEXT1664(auVar38);
                  fVar67 = (local_1140->super_RayK<1>).tfar;
                  auVar23._4_4_ = fVar67;
                  auVar23._0_4_ = fVar67;
                  auVar23._8_4_ = fVar67;
                  auVar23._12_4_ = fVar67;
                  uVar14 = vcmpps_avx512vl(auVar38,auVar23,2);
                  bVar36 = ~(byte)(1 << (uVar77 & 0x1f)) & bVar36 & (byte)uVar14;
                  uVar27 = vextractps_avx(auVar3,1);
                  auVar81 = ZEXT1664(auVar81._0_16_);
                  auVar82 = ZEXT1664(auVar82._0_16_);
                  auVar83 = ZEXT1664(auVar83._0_16_);
                  auVar84 = ZEXT1664(auVar84._0_16_);
                  auVar85 = ZEXT1664(auVar85._0_16_);
                  auVar86 = ZEXT1664(auVar86._0_16_);
                  auVar87 = ZEXT1664(auVar87._0_16_);
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar88 = ZEXT1664(auVar38);
                  auVar38 = vmovddup_avx512vl(ZEXT816(0x8000000080000000));
                  auVar89 = ZEXT1664(auVar38);
                  auVar41 = vxorps_avx512vl(auVar41,auVar41);
                  auVar90 = ZEXT1664(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar91 = ZEXT1664(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar92 = ZEXT1664(auVar41);
                }
                if (bVar36 == 0) break;
                auVar41 = vblendmps_avx512vl(auVar92._0_16_,auVar63._0_16_);
                auVar60._0_4_ =
                     (uint)(bVar36 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar36 & 1) * auVar42._0_4_;
                bVar6 = (bool)(bVar36 >> 1 & 1);
                auVar60._4_4_ = (uint)bVar6 * auVar41._4_4_ | (uint)!bVar6 * auVar42._4_4_;
                bVar6 = (bool)(bVar36 >> 2 & 1);
                auVar60._8_4_ = (uint)bVar6 * auVar41._8_4_ | (uint)!bVar6 * auVar42._8_4_;
                bVar6 = (bool)(bVar36 >> 3 & 1);
                auVar60._12_4_ = (uint)bVar6 * auVar41._12_4_ | (uint)!bVar6 * auVar42._12_4_;
                auVar41 = vshufps_avx(auVar60,auVar60,0xb1);
                auVar41 = vminps_avx(auVar41,auVar60);
                auVar42 = vshufpd_avx(auVar41,auVar41,1);
                auVar41 = vminps_avx(auVar42,auVar41);
                uVar14 = vcmpps_avx512vl(auVar60,auVar41,0);
                bVar30 = (byte)uVar14 & bVar36;
                bVar24 = bVar36;
                if (bVar30 != 0) {
                  bVar24 = bVar30;
                }
                uVar77 = 0;
                for (uVar31 = (uint)bVar24; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x80000000) {
                  uVar77 = uVar77 + 1;
                }
              } while( true );
            }
          }
        }
        fVar67 = (local_1140->super_RayK<1>).tfar;
        auVar63 = ZEXT1664(CONCAT412(fVar67,CONCAT48(fVar67,CONCAT44(fVar67,fVar67))));
        auVar65 = ZEXT464((uint)(local_1140->super_RayK<1>).tfar);
      }
      goto LAB_01bd5b0f;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }